

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void plot_vis(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,t_float basey,
             int tovis)

{
  int iVar1;
  t_word *ptVar2;
  int iVar3;
  _glist *p_Var4;
  _parentwidgetbehavior *p_Var5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  float fVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined4 uVar13;
  uint *xonsetp;
  undefined4 uVar14;
  int *yonsetp;
  undefined4 uVar15;
  t_float *visp;
  t_float *scalarvisp;
  t_float *editp;
  undefined4 uVar16;
  _fielddesc **xfield;
  _fielddesc **yfield;
  _fielddesc **wfield;
  t_float local_4334;
  int local_4324;
  t_float local_42d4;
  t_float local_42d0;
  t_float local_42a8;
  t_float local_42a4;
  float local_4274;
  _parentwidgetbehavior *wb_1;
  t_gobj *y_1;
  int i_1;
  _parentwidgetbehavior *wb;
  t_gobj *y;
  t_float local_4210;
  t_float useyloc;
  t_float usexloc_4;
  t_float usexloc_3;
  t_float usexloc_2;
  t_float usexloc_1;
  int ixpix_1;
  t_float xpix_1;
  t_float wval;
  t_float yval_2;
  int ndrawn_1;
  int lastpixel;
  int outline;
  int inextx;
  int ixpix;
  t_float usexloc;
  t_float nextxloc;
  t_float ypix;
  t_float xpix;
  t_float yval_1;
  int color;
  int ndrawn;
  t_float maxyval;
  t_float minyval;
  t_word coordinates [2048];
  char *tags [3];
  char local_198 [8];
  char tag0 [80];
  char tag [80];
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  char *elem;
  _array *p_Stack_d0;
  int nelem;
  _array *array;
  double xsum;
  float local_b8;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float yval;
  t_float style;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  t_float linewidth;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  uint local_78;
  int i;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  t_plot *x;
  t_float local_58;
  int tovis_local;
  t_float basey_local;
  t_float basex_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  undefined4 uVar12;
  
  coordinates[0x7ff].w_symbol = (t_symbol *)(tag0 + 0x48);
  visp = &edit;
  scalarvisp = &local_b8;
  editp = (t_float *)((long)&xsum + 4);
  xfield = &yfielddesc;
  yfield = &wfielddesc;
  wfield = (_fielddesc **)(tag + 0x48);
  _yonset = z;
  x._4_4_ = tovis;
  local_58 = basey;
  tovis_local = (int)basex;
  _basey_local = template;
  template_local = (t_template *)data;
  data_local = (t_word *)glist;
  glist_local = (_glist *)z;
  iVar3 = plot_readownertemplate
                    ((t_plot *)z,data,template,(t_symbol **)&xloc,&stack0xffffffffffffff30,&xinc,
                     &yloc,&style,&yval,&vis,visp,scalarvisp,editp,xfield,yfield,wfield);
  if ((iVar3 == 0) && (((edit != 0.0 || (NAN(edit))) || (x._4_4_ == 0)))) {
    xonsetp = &local_78;
    yonsetp = &xonset;
    uVar10 = tag._72_8_;
    iVar3 = array_getfields(_xloc,(_glist **)&elemtemplate,(t_template **)&elemtemplatesym,&wonset,
                            yfielddesc,wfielddesc,(_fielddesc *)tag._72_8_,(int *)xonsetp,yonsetp,&i
                           );
    uVar12 = SUB84(uVar10,4);
    if (iVar3 == 0) {
      elem._4_4_ = p_Stack_d0->a_n;
      xfielddesc = (_fielddesc *)p_Stack_d0->a_vec;
      sprintf(tag0 + 0x48,"plot%lx",template_local);
      uVar11 = CONCAT44(uVar12,xonset);
      sprintf(local_198,"plot%lx_array%lx_onset%+d%+d%+d",template_local,xfielddesc,(ulong)(uint)i,
              (ulong)local_78,uVar11);
      if ((*(ushort *)(data_local + 0x1d) >> 8 & 1) != 0) {
        iVar3 = glist_getzoom((_glist *)data_local);
        xinc = (float)iVar3 * xinc;
      }
      if (x._4_4_ == 0) {
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          for (y_1._4_4_ = 0; y_1._4_4_ < elem._4_4_; y_1._4_4_ = y_1._4_4_ + 1) {
            for (wb_1 = (_parentwidgetbehavior *)elemtemplate[1].t_pdobj;
                wb_1 != (_parentwidgetbehavior *)0x0;
                wb_1 = (_parentwidgetbehavior *)wb_1->w_parentdisplacefn) {
              p_Var5 = pd_getparentwidget((t_pd *)wb_1);
              if (p_Var5 != (_parentwidgetbehavior *)0x0) {
                (*p_Var5->w_parentvisfn)
                          ((t_gobj *)wb_1,(_glist *)data_local,
                           (t_word *)(&xfielddesc->fd_type + wonset * y_1._4_4_),
                           (t_template *)elemtemplatesym,0.0,0.0,0);
              }
            }
          }
        }
        p_Var4 = glist_getcanvas((_glist *)data_local);
        pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",tag0 + 0x48);
      }
      else {
        if ((vis != 0.0) || (NAN(vis))) {
          tVar6 = fielddesc_getfloat((_fielddesc *)&_yonset[3].g_next,_basey_local,
                                     (t_word *)template_local,1);
          iVar3 = numbertocolor((int)tVar6);
          yval_2 = -NAN;
          wval = 0.0;
          xpix_1 = 0.0;
          ixpix_1 = 0;
          usexloc_2 = 0.0;
          if (i < 0) {
            if (0.0 < xinc) {
              elemtemplatecanvas._4_4_ = 0;
              array = (_array *)(double)yloc;
              while( true ) {
                ptVar2 = data_local;
                iVar1 = tovis_local;
                uVar14 = (undefined4)((ulong)wfield >> 0x20);
                uVar13 = (undefined4)((ulong)xfield >> 0x20);
                uVar12 = (undefined4)((ulong)scalarvisp >> 0x20);
                if (elem._4_4_ <= elemtemplatecanvas._4_4_) break;
                if ((int)local_78 < 0) {
                  useyloc = (t_float)(double)array;
                  array = (_array *)((double)style + (double)array);
                }
                else {
                  useyloc = yloc + *(float *)(&xfielddesc->fd_type +
                                             (long)(int)local_78 +
                                             (long)(wonset * elemtemplatecanvas._4_4_));
                }
                if (xonset < 0) {
                  xpix_1 = 0.0;
                }
                else {
                  xpix_1 = *(t_float *)
                            (&xfielddesc->fd_type +
                            (long)xonset + (long)(wonset * elemtemplatecanvas._4_4_));
                }
                if ((1e+20 <= xpix_1) || (xpix_1 <= -1e+20)) {
                  local_4334 = 0.0;
                }
                else {
                  local_4334 = xpix_1;
                }
                xpix_1 = local_4334;
                tVar6 = fielddesc_cvttocoord(yfielddesc,useyloc);
                tVar6 = glist_xtopixels((_glist *)ptVar2,(float)iVar1 + tVar6);
                ptVar2 = data_local;
                usexloc_2 = (t_float)(int)(tVar6 + 0.5);
                if ((-1 < (int)local_78) || (usexloc_2 != yval_2)) {
                  (&maxyval)[(long)((int)wval << 1) * 2] = (float)(int)usexloc_2;
                  fVar9 = local_58 + yval;
                  tVar6 = fielddesc_cvttocoord(wfielddesc,local_4334);
                  tVar6 = glist_ytopixels((_glist *)ptVar2,fVar9 + tVar6);
                  (&maxyval)[(long)((int)wval * 2 + 1) * 2] = tVar6;
                  wval = (t_float)((int)wval + 1);
                }
                uVar14 = (undefined4)((ulong)wfield >> 0x20);
                uVar13 = (undefined4)((ulong)xfield >> 0x20);
                uVar12 = (undefined4)((ulong)scalarvisp >> 0x20);
                if (0x7ff < (uint)((int)wval << 1)) break;
                elemtemplatecanvas._4_4_ = elemtemplatecanvas._4_4_ + 1;
                yval_2 = usexloc_2;
              }
              ptVar2 = data_local;
              if (wval == 1.4013e-45) {
                coordinates[1]._0_4_ = (undefined4)((int)usexloc_2 + 10);
                fVar9 = local_58 + yval;
                tVar6 = fielddesc_cvttocoord(wfielddesc,xpix_1);
                coordinates[2]._0_4_ = glist_ytopixels((_glist *)ptVar2,fVar9 + tVar6);
                wval = 2.8026e-45;
              }
              if (wval != 0.0) {
                p_Var4 = glist_getcanvas((_glist *)data_local);
                pdgui_vmess((char *)0x0,"crr iiii rf rk ri rS",(double)xinc,p_Var4,"create","line",0
                            ,uVar11 & 0xffffffff00000000,(ulong)xonsetp & 0xffffffff00000000,
                            (ulong)yonsetp & 0xffffffff00000000,"-width","-fill",
                            CONCAT44(uVar12,iVar3),"-smooth",CONCAT44(uVar13,(uint)(vis == 2.0)),
                            "-tags",CONCAT44(uVar14,3),coordinates + 0x7ff);
                p_Var4 = glist_getcanvas((_glist *)data_local);
                pdgui_vmess((char *)0x0,"crs w",p_Var4,"coords",local_198,
                            (ulong)(uint)((int)wval << 1),&maxyval);
              }
            }
          }
          else {
            array = (_array *)(double)yloc;
            for (elemtemplatecanvas._4_4_ = 0; ptVar2 = data_local, iVar1 = tovis_local,
                elemtemplatecanvas._4_4_ < elem._4_4_;
                elemtemplatecanvas._4_4_ = elemtemplatecanvas._4_4_ + 1) {
              if ((int)local_78 < 0) {
                usexloc_3 = (t_float)(double)array;
                array = (_array *)((double)style + (double)array);
              }
              else {
                usexloc_3 = yloc + *(float *)(&xfielddesc->fd_type +
                                             (long)(int)local_78 +
                                             (long)(wonset * elemtemplatecanvas._4_4_));
              }
              if (xonset < 0) {
                xpix_1 = 0.0;
              }
              else {
                xpix_1 = *(t_float *)
                          (&xfielddesc->fd_type +
                          (long)xonset + (long)(wonset * elemtemplatecanvas._4_4_));
              }
              if ((1e+20 <= xpix_1) || (xpix_1 <= -1e+20)) {
                local_42a4 = 0.0;
              }
              else {
                local_42a4 = xpix_1;
              }
              xpix_1 = local_42a4;
              local_42a8 = *(t_float *)
                            (&xfielddesc->fd_type +
                            (long)i + (long)(wonset * elemtemplatecanvas._4_4_));
              if ((1e+20 <= local_42a8) || (local_42a8 <= -1e+20)) {
                local_42a8 = 0.0;
              }
              ixpix_1 = (int)local_42a8;
              tVar6 = fielddesc_cvttocoord(yfielddesc,usexloc_3);
              tVar6 = glist_xtopixels((_glist *)ptVar2,(float)iVar1 + tVar6);
              ptVar2 = data_local;
              usexloc_2 = (t_float)(int)(tVar6 + 0.5);
              if ((-1 < (int)local_78) || (usexloc_2 != yval_2)) {
                (&maxyval)[(long)((int)wval << 1) * 2] = (float)(int)usexloc_2;
                fVar9 = local_58 + yval;
                tVar6 = fielddesc_cvttocoord(wfielddesc,local_42a4);
                tVar7 = fielddesc_cvttocoord((_fielddesc *)tag._72_8_,local_42a8);
                tVar6 = glist_ytopixels((_glist *)ptVar2,(fVar9 + tVar6) - tVar7);
                (&maxyval)[(long)((int)wval * 2 + 1) * 2] = tVar6;
                wval = (t_float)((int)wval + 1);
              }
              uVar16 = (undefined4)((ulong)yfield >> 0x20);
              uVar15 = (undefined4)((ulong)editp >> 0x20);
              uVar14 = (undefined4)((ulong)visp >> 0x20);
              uVar13 = (undefined4)((ulong)yonsetp >> 0x20);
              uVar12 = (undefined4)(uVar11 >> 0x20);
              if (0x7ff < (uint)((int)wval << 1)) goto LAB_001827d1;
              yval_2 = usexloc_2;
            }
            yval_2 = -NAN;
            elemtemplatecanvas._4_4_ = elem._4_4_;
            do {
              ptVar2 = data_local;
              iVar1 = tovis_local;
              uVar16 = (undefined4)((ulong)yfield >> 0x20);
              uVar15 = (undefined4)((ulong)editp >> 0x20);
              uVar14 = (undefined4)((ulong)visp >> 0x20);
              uVar13 = (undefined4)((ulong)yonsetp >> 0x20);
              uVar12 = (undefined4)(uVar11 >> 0x20);
              elemtemplatecanvas._4_4_ = elemtemplatecanvas._4_4_ + -1;
              if (elemtemplatecanvas._4_4_ < 0) {
                if ((int)wval < 4) {
                  (&maxyval)[(long)((int)wval << 1) * 2] = (float)((int)usexloc_2 + 10);
                  fVar9 = local_58 + yval;
                  tVar6 = fielddesc_cvttocoord(wfielddesc,xpix_1);
                  tVar7 = fielddesc_cvttocoord((_fielddesc *)tag._72_8_,(t_float)ixpix_1);
                  tVar6 = glist_ytopixels((_glist *)ptVar2,(fVar9 + tVar6) - tVar7);
                  ptVar2 = data_local;
                  (&maxyval)[(long)((int)wval * 2 + 1) * 2] = tVar6;
                  (&maxyval)[(long)(((int)wval + 1) * 2) * 2] = (float)((int)usexloc_2 + 10);
                  fVar9 = local_58 + yval;
                  tVar6 = fielddesc_cvttocoord(wfielddesc,xpix_1);
                  tVar7 = fielddesc_cvttocoord((_fielddesc *)tag._72_8_,(t_float)ixpix_1);
                  tVar6 = glist_ytopixels((_glist *)ptVar2,fVar9 + tVar6 + tVar7);
                  (&maxyval)[(long)(((int)wval + 1) * 2 + 1) * 2] = tVar6;
                  wval = (t_float)((int)wval + 2);
                }
                break;
              }
              if ((int)local_78 < 0) {
                array = (_array *)((double)array - (double)style);
                usexloc_4 = (t_float)(double)array;
              }
              else {
                usexloc_4 = yloc + *(float *)(&xfielddesc->fd_type +
                                             (long)(int)local_78 +
                                             (long)(wonset * elemtemplatecanvas._4_4_));
              }
              if (xonset < 0) {
                xpix_1 = 0.0;
              }
              else {
                xpix_1 = *(t_float *)
                          (&xfielddesc->fd_type +
                          (long)xonset + (long)(wonset * elemtemplatecanvas._4_4_));
              }
              if ((1e+20 <= xpix_1) || (xpix_1 <= -1e+20)) {
                local_42d0 = 0.0;
              }
              else {
                local_42d0 = xpix_1;
              }
              xpix_1 = local_42d0;
              local_42d4 = *(t_float *)
                            (&xfielddesc->fd_type +
                            (long)i + (long)(wonset * elemtemplatecanvas._4_4_));
              if ((1e+20 <= local_42d4) || (local_42d4 <= -1e+20)) {
                local_42d4 = 0.0;
              }
              ixpix_1 = (int)local_42d4;
              tVar6 = fielddesc_cvttocoord(yfielddesc,usexloc_4);
              tVar6 = glist_xtopixels((_glist *)ptVar2,(float)iVar1 + tVar6);
              ptVar2 = data_local;
              usexloc_2 = (t_float)(int)(tVar6 + 0.5);
              if ((-1 < (int)local_78) || (usexloc_2 != yval_2)) {
                (&maxyval)[(long)((int)wval << 1) * 2] = (float)(int)usexloc_2;
                fVar9 = local_58 + yval;
                tVar6 = fielddesc_cvttocoord(wfielddesc,local_42d0);
                tVar7 = fielddesc_cvttocoord((_fielddesc *)tag._72_8_,local_42d4);
                tVar6 = glist_ytopixels((_glist *)ptVar2,fVar9 + tVar6 + tVar7);
                (&maxyval)[(long)((int)wval * 2 + 1) * 2] = tVar6;
                wval = (t_float)((int)wval + 1);
              }
              uVar16 = (undefined4)((ulong)yfield >> 0x20);
              uVar15 = (undefined4)((ulong)editp >> 0x20);
              uVar14 = (undefined4)((ulong)visp >> 0x20);
              uVar13 = (undefined4)((ulong)yonsetp >> 0x20);
              uVar12 = (undefined4)(uVar11 >> 0x20);
              yval_2 = usexloc_2;
            } while ((uint)((int)wval << 1) < 0x800);
LAB_001827d1:
            p_Var4 = glist_getcanvas((_glist *)data_local);
            if ((*(ushort *)(data_local + 0x1d) >> 8 & 1) == 0) {
              local_4324 = 1;
            }
            else {
              local_4324 = glist_getzoom((_glist *)data_local);
            }
            pdgui_vmess((char *)0x0,"crr ri rk rk ri rS",p_Var4,"create","polygon","-width",
                        CONCAT44(uVar12,local_4324),"-fill",CONCAT44(uVar13,iVar3),"-outline",
                        CONCAT44(uVar14,iVar3),"-smooth",CONCAT44(uVar15,(uint)(vis == 2.0)),"-tags"
                        ,CONCAT44(uVar16,3),coordinates + 0x7ff);
            p_Var4 = glist_getcanvas((_glist *)data_local);
            pdgui_vmess((char *)0x0,"crs w",p_Var4,"coords",local_198,(ulong)(uint)((int)wval << 1),
                        &maxyval);
          }
        }
        else {
          ndrawn = 0x60ad78ec;
          color = -0x1f528714;
          yval_1 = 0.0;
          tVar6 = fielddesc_getfloat((_fielddesc *)&_yonset[3].g_next,_basey_local,
                                     (t_word *)template_local,1);
          iVar3 = numbertocolor((int)tVar6);
          array = (_array *)(double)((float)tovis_local + yloc);
          for (elemtemplatecanvas._4_4_ = 0; ptVar2 = data_local,
              elemtemplatecanvas._4_4_ < elem._4_4_;
              elemtemplatecanvas._4_4_ = elemtemplatecanvas._4_4_ + 1) {
            if ((int)local_78 < 0) {
              fVar9 = (float)(double)array;
              array = (_array *)((double)style + (double)array);
              tVar6 = fielddesc_cvttocoord(yfielddesc,fVar9);
              tVar6 = glist_xtopixels((_glist *)ptVar2,tVar6);
              ptVar2 = data_local;
              outline = (int)tVar6;
              tVar6 = fielddesc_cvttocoord(yfielddesc,(float)(double)array);
              tVar6 = glist_xtopixels((_glist *)ptVar2,tVar6);
              lastpixel = (int)tVar6;
            }
            else {
              tVar6 = fielddesc_cvttocoord
                                (yfielddesc,
                                 (float)tovis_local + yloc +
                                 *(float *)(&xfielddesc->fd_type +
                                           (long)(int)local_78 +
                                           (long)(wonset * elemtemplatecanvas._4_4_)));
              tVar6 = glist_xtopixels((_glist *)ptVar2,tVar6);
              outline = (int)tVar6;
              lastpixel = outline + 2;
            }
            uVar16 = (undefined4)((ulong)xfield >> 0x20);
            uVar15 = (undefined4)((ulong)visp >> 0x20);
            uVar14 = (undefined4)((ulong)yonsetp >> 0x20);
            uVar13 = (undefined4)((ulong)xonsetp >> 0x20);
            uVar12 = (undefined4)(uVar11 >> 0x20);
            if (xonset < 0) {
              ypix = 0.0;
            }
            else {
              ypix = yval + *(float *)(&xfielddesc->fd_type +
                                      (long)xonset + (long)(wonset * elemtemplatecanvas._4_4_));
            }
            if ((1e+20 <= ypix) || (ypix <= -1e+20)) {
              local_4274 = 0.0;
            }
            else {
              local_4274 = ypix;
            }
            if (local_4274 < (float)ndrawn) {
              ndrawn = (int)local_4274;
            }
            if ((float)color < local_4274) {
              color = (int)local_4274;
            }
            if ((elemtemplatecanvas._4_4_ == elem._4_4_ + -1) || (lastpixel != outline)) {
              p_Var4 = glist_getcanvas((_glist *)data_local);
              ptVar2 = data_local;
              tVar6 = local_58;
              tVar7 = fielddesc_cvttocoord(wfielddesc,(t_float)ndrawn);
              tVar7 = glist_ytopixels((_glist *)ptVar2,tVar6 + tVar7);
              ptVar2 = data_local;
              tVar6 = local_58;
              tVar8 = fielddesc_cvttocoord(wfielddesc,(t_float)color);
              tVar6 = glist_ytopixels((_glist *)ptVar2,tVar6 + tVar8);
              uVar11 = CONCAT44(uVar12,(int)tVar7);
              xonsetp = (uint *)CONCAT44(uVar13,lastpixel);
              yonsetp = (int *)CONCAT44(uVar14,(int)(tVar6 + xinc));
              visp = (t_float *)CONCAT44(uVar15,iVar3);
              xfield = (_fielddesc **)CONCAT44(uVar16,3);
              pdgui_vmess((char *)0x0,"crr iiii rk rf rS",0,p_Var4,"create","rectangle",
                          (ulong)(uint)outline,uVar11,xonsetp,yonsetp,"-fill",visp,"-width","-tags",
                          xfield,coordinates + 0x7ff);
              yval_1 = (t_float)((int)yval_1 + 1);
              ndrawn = 0x60ad78ec;
              color = -0x1f528714;
            }
            if (2000 < (int)yval_1) break;
          }
        }
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          array = (_array *)(double)yloc;
          for (elemtemplatecanvas._4_4_ = 0; elemtemplatecanvas._4_4_ < elem._4_4_;
              elemtemplatecanvas._4_4_ = elemtemplatecanvas._4_4_ + 1) {
            if ((int)local_78 < 0) {
              local_4210 = (t_float)((double)(float)tovis_local + (double)array);
              array = (_array *)((double)style + (double)array);
            }
            else {
              local_4210 = (float)tovis_local + yloc +
                           *(float *)(&xfielddesc->fd_type +
                                     (long)(int)local_78 + (long)(wonset * elemtemplatecanvas._4_4_)
                                     );
            }
            if (xonset < 0) {
              scalarvis = 0.0;
            }
            else {
              scalarvis = *(t_float *)
                           (&xfielddesc->fd_type +
                           (long)xonset + (long)(wonset * elemtemplatecanvas._4_4_));
            }
            fVar9 = local_58 + yval;
            tVar6 = fielddesc_cvttocoord(wfielddesc,scalarvis);
            for (wb = (_parentwidgetbehavior *)elemtemplate[1].t_pdobj;
                wb != (_parentwidgetbehavior *)0x0;
                wb = (_parentwidgetbehavior *)wb->w_parentdisplacefn) {
              p_Var5 = pd_getparentwidget((t_pd *)wb);
              if (p_Var5 != (_parentwidgetbehavior *)0x0) {
                (*p_Var5->w_parentvisfn)
                          ((t_gobj *)wb,(_glist *)data_local,
                           (t_word *)(&xfielddesc->fd_type + wonset * elemtemplatecanvas._4_4_),
                           (t_template *)elemtemplatesym,local_4210,fVar9 + tVar6,x._4_4_);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void plot_vis(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int tovis)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset, i;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval,
        vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int nelem;
    char *elem;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
    char tag[80], tag0[80];
    const char*tags[] = {tag, tag0, "array"};
        /* even if the array is "invisible", if its visibility is
        set by an instance variable you have to explicitly erase it,
        because the flag could earlier have been on when we were getting
        drawn.  Rather than look to try to find out whether we're
        visible we just do the erasure.  At the TK level this should
        cause no action because the tag matches nobody.  LATER we
        might want to optimize this somehow.  Ditto the "vis()" routines
        for other drawing instructions. */

    if (plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) ||
            ((vis == 0) && tovis) /* see above for 'tovis' */
            || array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize, xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
                    return;
    nelem = array->a_n;
    elem = (char *)array->a_vec;

    sprintf(tag , "plot%lx", data);
        /* a tag that uniquely identifies the sub-plot */
    sprintf(tag0, "plot%lx_array%lx_onset%+d%+d%+d", data, elem, wonset, xonset, yonset);

    if (glist->gl_isgraph)
        linewidth *= glist_getzoom(glist);

    if (tovis)
    {
         /* we use t_word because pdgui_vmess() has a convenient FLOATWORDS type
          * FLOATARRAY is impractical (as it sends a list, and the GUI expects arguments)
          */
        t_word coordinates[1024*2];

        if (style == PLOTSTYLE_POINTS)
        {
            t_float minyval = 1e20, maxyval = -1e20;
            int ndrawn = 0;
            int color = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));

            for (xsum = basex + xloc, i = 0; i < nelem; i++)
            {
                t_float yval, xpix, ypix, nextxloc, usexloc;
                int ixpix, inextx;

                if (xonset >= 0)
                {
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = ixpix + 2;
                }
                else
                {
                    usexloc = xsum;
                    xsum += xinc;
                    ixpix = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, usexloc));
                    inextx = glist_xtopixels(glist,
                        fielddesc_cvttocoord(xfielddesc, xsum));
                }

                if (yonset >= 0)
                    yval = yloc + *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                yval = CLIP(yval);
                if (yval < minyval)
                    minyval = yval;
                if (yval > maxyval)
                    maxyval = yval;
                if (i == nelem-1 || inextx != ixpix)
                {

                    pdgui_vmess(0, "crr iiii rk rf rS",
                        glist_getcanvas(glist), "create", "rectangle",
                        ixpix , (int) glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, minyval)),
                        inextx, (int)(glist_ytopixels(glist, basey + fielddesc_cvttocoord(yfielddesc, maxyval)) + linewidth),
                        "-fill", color,
                        "-width", 0.,
                        "-tags", 3, tags);
                    ndrawn++;
                    minyval = 1e20;
                    maxyval = -1e20;
                }
                if (ndrawn > 2000) break;
            }
        }
        else
        {
            int outline = numbertocolor(
                fielddesc_getfloat(&x->x_outlinecolor, template, data, 1));
            int lastpixel = -1, ndrawn = 0;
            t_float yval = 0, wval = 0, xpix;
            int ixpix = 0;
                /* draw the trace */


            if (wonset >= 0)
            {
                    /* found "w" field which controls linewidth.  The trace is
                    a filled polygon with 2n points. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            - fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }
                lastpixel = -1;
                for (i = nelem-1; i >= 0; i--)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else xsum -= xinc, usexloc = xsum;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);
                    wval = *(t_float *)((elem + elemsize * i) + wonset);
                    wval = CLIP(wval);
                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval)
                            + fielddesc_cvttocoord(wfielddesc, wval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates))
                        goto ouch;
                }

                    /* TK will complain if there aren't at least 3 points.
                    There should be at least two already. */
                if (ndrawn < 4)
                {
                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        - fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;

                    coordinates[ndrawn*2+0].w_float = ixpix + 10;
                    coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                        glist,
                        basey
                        + yloc
                        + fielddesc_cvttocoord(yfielddesc, yval)
                        + fielddesc_cvttocoord(wfielddesc, wval));
                    ndrawn++;
                }
            ouch:

                pdgui_vmess(0, "crr ri rk rk ri rS",
                    glist_getcanvas(glist), "create", "polygon",
                    "-width", (glist->gl_isgraph ? glist_getzoom(glist) : 1),
                    "-fill", outline,
                    "-outline", outline,
                    "-smooth", (style == PLOTSTYLE_BEZ),
                    "-tags", 3, tags);

                pdgui_vmess(0, "crs w",
                    glist_getcanvas(glist), "coords", tag0,
                    ndrawn*2, coordinates);
            }
            else if (linewidth > 0)
            {
                    /* no "w" field.  If the linewidth is positive, draw a
                    segmented line with the requested width; otherwise don't
                    draw the trace at all. */
                for (i = 0, xsum = xloc; i < nelem; i++)
                {
                    t_float usexloc;
                    if (xonset >= 0)
                        usexloc = xloc + *(t_float *)((elem + elemsize * i)
                            + xonset);
                    else usexloc = xsum, xsum += xinc;
                    if (yonset >= 0)
                        yval = *(t_float *)((elem + elemsize * i) + yonset);
                    else yval = 0;
                    yval = CLIP(yval);


                    xpix = glist_xtopixels(glist,
                        basex + fielddesc_cvttocoord(xfielddesc, usexloc));
                    ixpix = xpix + 0.5;
                    if (xonset >= 0 || ixpix != lastpixel)
                    {
                        coordinates[ndrawn*2+0].w_float = ixpix;
                        coordinates[ndrawn*2+1].w_float = glist_ytopixels(
                            glist,
                            basey
                            + yloc
                            + fielddesc_cvttocoord(yfielddesc, yval));
                        ndrawn++;
                    }
                    lastpixel = ixpix;
                    if (ndrawn*2 >= sizeof(coordinates)/sizeof(*coordinates)) break;
                }

                    /* TK will complain if there aren't at least 2 points... */
                if (ndrawn == 1)
                {
                    coordinates[2].w_float = ixpix + 10;
                    coordinates[3].w_float = glist_ytopixels(glist, basey + yloc + fielddesc_cvttocoord(yfielddesc, yval));
                    ndrawn = 2;
                }

                if(ndrawn)
                {
                    pdgui_vmess(0, "crr iiii rf rk ri rS",
                        glist_getcanvas(glist), "create", "line",
                        0, 0, 0, 0,
                        "-width", linewidth,
                        "-fill", outline,
                        "-smooth", (style == PLOTSTYLE_BEZ),
                        "-tags", 3, tags);
                    pdgui_vmess(0, "crs w",
                        glist_getcanvas(glist), "coords", tag0,
                        ndrawn*2, coordinates);
                }
            }
        }
            /* We're done with the outline; now draw all the points.
            This code is inefficient since the template has to be
            searched for drawing instructions for every last point. */
        if (scalarvis != 0)
        {
            for (xsum = xloc, i = 0; i < nelem; i++)
            {
                t_float usexloc, useyloc;
                t_gobj *y;
                if (xonset >= 0)
                    usexloc = basex + xloc +
                        *(t_float *)((elem + elemsize * i) + xonset);
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)((elem + elemsize * i) + yonset);
                else yval = 0;
                useyloc = basey + yloc +
                    fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i),
                            elemtemplate, usexloc, useyloc, tovis);
                }
            }
        }
    }
    else
    {
            /* un-draw the individual points */
        if (scalarvis != 0)
        {
            int i;
            for (i = 0; i < nelem; i++)
            {
                t_gobj *y;
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentvisfn)(y, glist,
                        (t_word *)(elem + elemsize * i), elemtemplate,
                            0, 0, 0);
                }
            }
        }
            /* and then the trace */
        pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", tag);
    }
}